

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O0

xmlChar * xmlSchemaGetComponentDesignation(xmlChar **buf,void *item)

{
  xmlChar *pxVar1;
  xmlChar *pxVar2;
  xmlChar *local_20;
  xmlChar *str;
  void *item_local;
  xmlChar **buf_local;
  
  local_20 = (xmlChar *)0x0;
  pxVar2 = *buf;
  str = (xmlChar *)item;
  item_local = buf;
  pxVar1 = xmlSchemaGetComponentTypeStr((xmlSchemaBasicItemPtr)item);
  pxVar2 = xmlStrcat(pxVar2,pxVar1);
  *(xmlChar **)item_local = pxVar2;
  pxVar2 = xmlStrcat(*item_local," \'");
  *(xmlChar **)item_local = pxVar2;
  pxVar2 = *item_local;
  pxVar1 = xmlSchemaGetComponentQName(&local_20,str);
  pxVar2 = xmlStrcat(pxVar2,pxVar1);
  *(xmlChar **)item_local = pxVar2;
  pxVar2 = xmlStrcat(*item_local,"\'");
  *(xmlChar **)item_local = pxVar2;
  if (local_20 != (xmlChar *)0x0) {
    (*xmlFree)(local_20);
  }
  return *item_local;
}

Assistant:

static const xmlChar*
xmlSchemaGetComponentDesignation(xmlChar **buf, void *item)
{
    xmlChar *str = NULL;

    *buf = xmlStrcat(*buf, WXS_ITEM_TYPE_NAME(item));
    *buf = xmlStrcat(*buf, BAD_CAST " '");
    *buf = xmlStrcat(*buf, xmlSchemaGetComponentQName(&str,
	(xmlSchemaBasicItemPtr) item));
    *buf = xmlStrcat(*buf, BAD_CAST "'");
    FREE_AND_NULL(str);
    return(*buf);
}